

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O1

Vec_Str_t *
Abc_SclProduceGenlibStrProfile
          (SC_Lib *p,Mio_Library_t *pLib,float Slew,float Gain,int nGatesMin,int *pnCellCount)

{
  char cVar1;
  uint uVar2;
  void *pvVar3;
  SC_Cell *pRepr;
  undefined8 *puVar4;
  int iVar5;
  long lVar6;
  Vec_Str_t *pVVar7;
  char *pcVar8;
  Mio_Gate_t *pGate;
  char *pcVar9;
  int iVar10;
  SC_Cell *pSVar11;
  size_t sVar12;
  long lVar13;
  SC_Lib *p_00;
  int iVar14;
  SC_Cell *pCell;
  void *pvVar15;
  int i;
  long lVar16;
  SC_Lib *__size;
  int iVar17;
  SC_Lib *pSVar18;
  int i_3;
  size_t sVar19;
  ulong uVar20;
  float fVar21;
  char Buffer [200];
  SC_Lib local_f8;
  
  lVar6 = (long)(p->vCellClasses).nSize;
  lVar16 = 0;
  iVar17 = 0;
  if (0 < lVar6) {
    lVar13 = 0;
    iVar17 = 0;
    do {
      pvVar3 = (p->vCellClasses).pArray[lVar13];
      if (*(int *)((long)pvVar3 + 0x44) == 1) {
        iVar14 = 0;
        pvVar15 = pvVar3;
        do {
          iVar14 = iVar14 + (uint)(*(int *)((long)pvVar15 + 0xc) == 0);
          pvVar15 = *(void **)((long)pvVar15 + 0x48);
        } while (pvVar15 != pvVar3);
        if (iVar17 <= iVar14) {
          iVar17 = iVar14;
        }
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 != lVar6);
  }
  iVar14 = 0;
  if (nGatesMin < iVar17) {
    iVar14 = nGatesMin;
  }
  Abc_SclMarkSkippedCells(p);
  pVVar7 = (Vec_Str_t *)malloc(0x10);
  pVVar7->nCap = 1000;
  pVVar7->nSize = 0;
  pcVar8 = (char *)malloc(1000);
  pVVar7->pArray = pcVar8;
  do {
    cVar1 = "GATE _const0_            0.00 z=CONST0;\n"[lVar16];
    uVar2 = pVVar7->nCap;
    if (pVVar7->nSize == uVar2) {
      if ((int)uVar2 < 0x10) {
        if (pVVar7->pArray == (char *)0x0) {
          pcVar8 = (char *)malloc(0x10);
        }
        else {
          pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
        }
        sVar19 = 0x10;
      }
      else {
        sVar19 = (ulong)uVar2 * 2;
        if ((int)sVar19 <= (int)uVar2) goto LAB_003f2aaf;
        if (pVVar7->pArray == (char *)0x0) {
          pcVar8 = (char *)malloc(sVar19);
        }
        else {
          pcVar8 = (char *)realloc(pVVar7->pArray,sVar19);
        }
      }
      pVVar7->pArray = pcVar8;
      pVVar7->nCap = (int)sVar19;
    }
LAB_003f2aaf:
    iVar17 = pVVar7->nSize;
    pVVar7->nSize = iVar17 + 1;
    pVVar7->pArray[iVar17] = cVar1;
    lVar16 = lVar16 + 1;
  } while (lVar16 != 0x28);
  lVar6 = 0;
  do {
    cVar1 = "GATE _const1_            0.00 z=CONST1;\n"[lVar6];
    uVar2 = pVVar7->nCap;
    if (pVVar7->nSize == uVar2) {
      if ((int)uVar2 < 0x10) {
        if (pVVar7->pArray == (char *)0x0) {
          pcVar8 = (char *)malloc(0x10);
        }
        else {
          pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
        }
        sVar19 = 0x10;
      }
      else {
        sVar19 = (ulong)uVar2 * 2;
        if ((int)sVar19 <= (int)uVar2) goto LAB_003f2b3e;
        if (pVVar7->pArray == (char *)0x0) {
          pcVar8 = (char *)malloc(sVar19);
        }
        else {
          pcVar8 = (char *)realloc(pVVar7->pArray,sVar19);
        }
      }
      pVVar7->pArray = pcVar8;
      pVVar7->nCap = (int)sVar19;
    }
LAB_003f2b3e:
    iVar17 = pVVar7->nSize;
    pVVar7->nSize = iVar17 + 1;
    pVVar7->pArray[iVar17] = cVar1;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x28);
  if (nGatesMin == 0) {
    iVar14 = nGatesMin;
  }
  if ((p->vCells).nSize < 1) {
    iVar17 = 2;
  }
  else {
    iVar17 = 2;
    lVar6 = 0;
    do {
      pRepr = (SC_Cell *)(p->vCells).pArray[lVar6];
      iVar5 = pRepr->n_inputs;
      if ((iVar5 != 0) && (pRepr->n_outputs < 2)) {
        if ((iVar14 != 0) && (2 < iVar5)) {
          iVar10 = 0;
          pSVar11 = pRepr;
          do {
            iVar10 = iVar10 + (uint)(pSVar11->fSkip == 0);
            pSVar11 = pSVar11->pNext;
          } while (pSVar11 != pRepr);
          if (iVar10 < iVar14) goto LAB_003f341b;
        }
        if ((iVar5 < 2) ||
           ((pGate = Mio_LibraryReadGateByName(pLib,pRepr->pName,(char *)0x0),
            pGate != (Mio_Gate_t *)0x0 && (iVar5 = Mio_GateReadProfile(pGate), iVar5 != 0)))) {
          sVar19 = strlen(pRepr->pName);
          if (199 < sVar19) {
            __assert_fail("strlen(pRepr->pName) < 200",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLibUtil.c"
                          ,0x3c3,
                          "Vec_Str_t *Abc_SclProduceGenlibStrProfile(SC_Lib *, Mio_Library_t *, float, float, int, int *)"
                         );
          }
          lVar16 = 0;
          do {
            cVar1 = "GATE "[lVar16];
            uVar2 = pVVar7->nCap;
            if (pVVar7->nSize == uVar2) {
              if ((int)uVar2 < 0x10) {
                if (pVVar7->pArray == (char *)0x0) {
                  pcVar8 = (char *)malloc(0x10);
                }
                else {
                  pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
                }
                sVar19 = 0x10;
              }
              else {
                sVar19 = (ulong)uVar2 * 2;
                if ((int)sVar19 <= (int)uVar2) goto LAB_003f2c82;
                if (pVVar7->pArray == (char *)0x0) {
                  pcVar8 = (char *)malloc(sVar19);
                }
                else {
                  pcVar8 = (char *)realloc(pVVar7->pArray,sVar19);
                }
              }
              pVVar7->pArray = pcVar8;
              pVVar7->nCap = (int)sVar19;
            }
LAB_003f2c82:
            iVar5 = pVVar7->nSize;
            pVVar7->nSize = iVar5 + 1;
            pVVar7->pArray[iVar5] = cVar1;
            lVar16 = lVar16 + 1;
          } while (lVar16 != 5);
          sprintf((char *)&local_f8,"%-16s",pRepr->pName);
          sVar19 = strlen((char *)&local_f8);
          if (0 < (int)(uint)sVar19) {
            uVar20 = 0;
            do {
              cVar1 = *(char *)((long)&local_f8.pName + uVar20);
              uVar2 = pVVar7->nCap;
              if (pVVar7->nSize == uVar2) {
                if ((int)uVar2 < 0x10) {
                  if (pVVar7->pArray == (char *)0x0) {
                    pcVar8 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
                  }
                  sVar12 = 0x10;
                }
                else {
                  sVar12 = (ulong)uVar2 * 2;
                  if ((int)sVar12 <= (int)uVar2) goto LAB_003f2d45;
                  if (pVVar7->pArray == (char *)0x0) {
                    pcVar8 = (char *)malloc(sVar12);
                  }
                  else {
                    pcVar8 = (char *)realloc(pVVar7->pArray,sVar12);
                  }
                }
                pVVar7->pArray = pcVar8;
                pVVar7->nCap = (int)sVar12;
              }
LAB_003f2d45:
              iVar5 = pVVar7->nSize;
              pVVar7->nSize = iVar5 + 1;
              pVVar7->pArray[iVar5] = cVar1;
              uVar20 = uVar20 + 1;
            } while (((uint)sVar19 & 0x7fffffff) != uVar20);
          }
          uVar2 = pVVar7->nCap;
          if (pVVar7->nSize == uVar2) {
            if ((int)uVar2 < 0x10) {
              if (pVVar7->pArray == (char *)0x0) {
                pcVar8 = (char *)malloc(0x10);
              }
              else {
                pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
              }
              sVar19 = 0x10;
            }
            else {
              sVar19 = (ulong)uVar2 * 2;
              if ((int)sVar19 <= (int)uVar2) goto LAB_003f2dca;
              if (pVVar7->pArray == (char *)0x0) {
                pcVar8 = (char *)malloc(sVar19);
              }
              else {
                pcVar8 = (char *)realloc(pVVar7->pArray,sVar19);
              }
            }
            pVVar7->pArray = pcVar8;
            pVVar7->nCap = (int)sVar19;
          }
LAB_003f2dca:
          iVar5 = pVVar7->nSize;
          pVVar7->nSize = iVar5 + 1;
          pVVar7->pArray[iVar5] = ' ';
          sprintf((char *)&local_f8,"%7.2f",(double)pRepr->area);
          sVar19 = strlen((char *)&local_f8);
          if (0 < (int)(uint)sVar19) {
            uVar20 = 0;
            do {
              cVar1 = *(char *)((long)&local_f8.pName + uVar20);
              uVar2 = pVVar7->nCap;
              if (pVVar7->nSize == uVar2) {
                if ((int)uVar2 < 0x10) {
                  if (pVVar7->pArray == (char *)0x0) {
                    pcVar8 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
                  }
                  sVar12 = 0x10;
                }
                else {
                  sVar12 = (ulong)uVar2 * 2;
                  if ((int)sVar12 <= (int)uVar2) goto LAB_003f2e71;
                  if (pVVar7->pArray == (char *)0x0) {
                    pcVar8 = (char *)malloc(sVar12);
                  }
                  else {
                    pcVar8 = (char *)realloc(pVVar7->pArray,sVar12);
                  }
                }
                pVVar7->pArray = pcVar8;
                pVVar7->nCap = (int)sVar12;
              }
LAB_003f2e71:
              iVar5 = pVVar7->nSize;
              pVVar7->nSize = iVar5 + 1;
              pVVar7->pArray[iVar5] = cVar1;
              uVar20 = uVar20 + 1;
            } while (((uint)sVar19 & 0x7fffffff) != uVar20);
          }
          uVar2 = pVVar7->nCap;
          if (pVVar7->nSize == uVar2) {
            if ((int)uVar2 < 0x10) {
              if (pVVar7->pArray == (char *)0x0) {
                pcVar8 = (char *)malloc(0x10);
              }
              else {
                pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
              }
              sVar19 = 0x10;
            }
            else {
              sVar19 = (ulong)uVar2 * 2;
              if ((int)sVar19 <= (int)uVar2) goto LAB_003f2ef6;
              if (pVVar7->pArray == (char *)0x0) {
                pcVar8 = (char *)malloc(sVar19);
              }
              else {
                pcVar8 = (char *)realloc(pVVar7->pArray,sVar19);
              }
            }
            pVVar7->pArray = pcVar8;
            pVVar7->nCap = (int)sVar19;
          }
LAB_003f2ef6:
          iVar5 = pVVar7->nSize;
          pVVar7->nSize = iVar5 + 1;
          pVVar7->pArray[iVar5] = ' ';
          iVar5 = pRepr->n_inputs;
          if (((long)iVar5 < 0) || ((pRepr->vPins).nSize <= iVar5)) goto LAB_003f3579;
          pcVar8 = *(pRepr->vPins).pArray[iVar5];
          sVar19 = strlen(pcVar8);
          if (0 < (int)(uint)sVar19) {
            uVar20 = 0;
            do {
              cVar1 = pcVar8[uVar20];
              uVar2 = pVVar7->nCap;
              if (pVVar7->nSize == uVar2) {
                if ((int)uVar2 < 0x10) {
                  if (pVVar7->pArray == (char *)0x0) {
                    pcVar9 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar9 = (char *)realloc(pVVar7->pArray,0x10);
                  }
                  sVar12 = 0x10;
                }
                else {
                  sVar12 = (ulong)uVar2 * 2;
                  if ((int)sVar12 <= (int)uVar2) goto LAB_003f2fa5;
                  if (pVVar7->pArray == (char *)0x0) {
                    pcVar9 = (char *)malloc(sVar12);
                  }
                  else {
                    pcVar9 = (char *)realloc(pVVar7->pArray,sVar12);
                  }
                }
                pVVar7->pArray = pcVar9;
                pVVar7->nCap = (int)sVar12;
              }
LAB_003f2fa5:
              iVar5 = pVVar7->nSize;
              pVVar7->nSize = iVar5 + 1;
              pVVar7->pArray[iVar5] = cVar1;
              uVar20 = uVar20 + 1;
            } while (((uint)sVar19 & 0x7fffffff) != uVar20);
          }
          uVar2 = pVVar7->nCap;
          if (pVVar7->nSize == uVar2) {
            if ((int)uVar2 < 0x10) {
              if (pVVar7->pArray == (char *)0x0) {
                pcVar8 = (char *)malloc(0x10);
              }
              else {
                pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
              }
              sVar19 = 0x10;
            }
            else {
              sVar19 = (ulong)uVar2 * 2;
              if ((int)sVar19 <= (int)uVar2) goto LAB_003f302a;
              if (pVVar7->pArray == (char *)0x0) {
                pcVar8 = (char *)malloc(sVar19);
              }
              else {
                pcVar8 = (char *)realloc(pVVar7->pArray,sVar19);
              }
            }
            pVVar7->pArray = pcVar8;
            pVVar7->nCap = (int)sVar19;
          }
LAB_003f302a:
          iVar5 = pVVar7->nSize;
          pVVar7->nSize = iVar5 + 1;
          pVVar7->pArray[iVar5] = '=';
          iVar5 = pRepr->n_inputs;
          if (((long)iVar5 < 0) || ((pRepr->vPins).nSize <= iVar5)) {
LAB_003f3579:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pSVar18 = *(SC_Lib **)((long)(pRepr->vPins).pArray[iVar5] + 0x28);
          if (pSVar18 == (SC_Lib *)0x0) {
            pSVar18 = (SC_Lib *)0x902e00;
          }
          p_00 = pSVar18;
          sVar19 = strlen((char *)pSVar18);
          if (0 < (int)(uint)sVar19) {
            uVar20 = 0;
            do {
              cVar1 = *(char *)((long)&pSVar18->pName + uVar20);
              uVar2 = pVVar7->nCap;
              if (pVVar7->nSize == uVar2) {
                if ((int)uVar2 < 0x10) {
                  p_00 = (SC_Lib *)pVVar7->pArray;
                  if (p_00 == (SC_Lib *)0x0) {
                    p_00 = (SC_Lib *)&DAT_00000010;
                    pcVar8 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar8 = (char *)realloc(p_00,0x10);
                  }
                  __size = (SC_Lib *)&DAT_00000010;
                }
                else {
                  __size = (SC_Lib *)((ulong)uVar2 * 2);
                  if ((int)__size <= (int)uVar2) goto LAB_003f30e8;
                  p_00 = (SC_Lib *)pVVar7->pArray;
                  if (p_00 == (SC_Lib *)0x0) {
                    p_00 = __size;
                    pcVar8 = (char *)malloc((size_t)__size);
                  }
                  else {
                    pcVar8 = (char *)realloc(p_00,(size_t)__size);
                  }
                }
                pVVar7->pArray = pcVar8;
                pVVar7->nCap = (int)__size;
              }
LAB_003f30e8:
              iVar5 = pVVar7->nSize;
              pVVar7->nSize = iVar5 + 1;
              pVVar7->pArray[iVar5] = cVar1;
              uVar20 = uVar20 + 1;
            } while (((uint)sVar19 & 0x7fffffff) != uVar20);
          }
          lVar16 = 0;
          do {
            cVar1 = " ) ;\n"[lVar16 + 3];
            uVar2 = pVVar7->nCap;
            if (pVVar7->nSize == uVar2) {
              if ((int)uVar2 < 0x10) {
                p_00 = (SC_Lib *)pVVar7->pArray;
                if (p_00 == (SC_Lib *)0x0) {
                  p_00 = (SC_Lib *)&DAT_00000010;
                  pcVar8 = (char *)malloc(0x10);
                }
                else {
                  pcVar8 = (char *)realloc(p_00,0x10);
                }
                pSVar18 = (SC_Lib *)&DAT_00000010;
              }
              else {
                pSVar18 = (SC_Lib *)((ulong)uVar2 * 2);
                if ((int)pSVar18 <= (int)uVar2) goto LAB_003f3171;
                p_00 = (SC_Lib *)pVVar7->pArray;
                if (p_00 == (SC_Lib *)0x0) {
                  p_00 = pSVar18;
                  pcVar8 = (char *)malloc((size_t)pSVar18);
                }
                else {
                  pcVar8 = (char *)realloc(p_00,(size_t)pSVar18);
                }
              }
              pVVar7->pArray = pcVar8;
              pVVar7->nCap = (int)pSVar18;
            }
LAB_003f3171:
            iVar5 = pVVar7->nSize;
            pVVar7->nSize = iVar5 + 1;
            pVVar7->pArray[iVar5] = cVar1;
            lVar16 = lVar16 + 1;
          } while (lVar16 != 2);
          if (0 < pRepr->n_inputs) {
            lVar16 = 0;
            do {
              if ((pRepr->vPins).nSize <= lVar16) goto LAB_003f3579;
              puVar4 = (undefined8 *)(pRepr->vPins).pArray[lVar16];
              fVar21 = Abc_SclComputeDelayClassPin(p_00,pRepr,(int)lVar16,Slew,Gain);
              if (fVar21 <= 0.0) {
                __assert_fail("Delay > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLibUtil.c"
                              ,0x3d3,
                              "Vec_Str_t *Abc_SclProduceGenlibStrProfile(SC_Lib *, Mio_Library_t *, float, float, int, int *)"
                             );
              }
              lVar13 = 0;
              do {
                cVar1 = "         PIN "[lVar13];
                uVar2 = pVVar7->nCap;
                if (pVVar7->nSize == uVar2) {
                  if ((int)uVar2 < 0x10) {
                    if (pVVar7->pArray == (char *)0x0) {
                      pcVar8 = (char *)malloc(0x10);
                    }
                    else {
                      pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
                    }
                    sVar19 = 0x10;
                  }
                  else {
                    sVar19 = (ulong)uVar2 * 2;
                    if ((int)sVar19 <= (int)uVar2) goto LAB_003f324a;
                    if (pVVar7->pArray == (char *)0x0) {
                      pcVar8 = (char *)malloc(sVar19);
                    }
                    else {
                      pcVar8 = (char *)realloc(pVVar7->pArray,sVar19);
                    }
                  }
                  pVVar7->pArray = pcVar8;
                  pVVar7->nCap = (int)sVar19;
                }
LAB_003f324a:
                iVar5 = pVVar7->nSize;
                pVVar7->nSize = iVar5 + 1;
                pVVar7->pArray[iVar5] = cVar1;
                lVar13 = lVar13 + 1;
              } while (lVar13 != 0xd);
              sprintf((char *)&local_f8,"%-4s",*puVar4);
              sVar19 = strlen((char *)&local_f8);
              if (0 < (int)(uint)sVar19) {
                uVar20 = 0;
                do {
                  cVar1 = *(char *)((long)&local_f8.pName + uVar20);
                  uVar2 = pVVar7->nCap;
                  if (pVVar7->nSize == uVar2) {
                    if ((int)uVar2 < 0x10) {
                      if (pVVar7->pArray == (char *)0x0) {
                        pcVar8 = (char *)malloc(0x10);
                      }
                      else {
                        pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
                      }
                      sVar12 = 0x10;
                    }
                    else {
                      sVar12 = (ulong)uVar2 * 2;
                      if ((int)sVar12 <= (int)uVar2) goto LAB_003f3306;
                      if (pVVar7->pArray == (char *)0x0) {
                        pcVar8 = (char *)malloc(sVar12);
                      }
                      else {
                        pcVar8 = (char *)realloc(pVVar7->pArray,sVar12);
                      }
                    }
                    pVVar7->pArray = pcVar8;
                    pVVar7->nCap = (int)sVar12;
                  }
LAB_003f3306:
                  iVar5 = pVVar7->nSize;
                  pVVar7->nSize = iVar5 + 1;
                  pVVar7->pArray[iVar5] = cVar1;
                  uVar20 = uVar20 + 1;
                } while (((uint)sVar19 & 0x7fffffff) != uVar20);
              }
              p_00 = &local_f8;
              sprintf((char *)p_00," UNKNOWN  1  999  %7.2f  0.00  %7.2f  0.00\n",(double)fVar21,
                      SUB84((double)fVar21,0));
              sVar19 = strlen((char *)p_00);
              if (0 < (int)(uint)sVar19) {
                uVar20 = 0;
                do {
                  cVar1 = *(char *)((long)&local_f8.pName + uVar20);
                  uVar2 = pVVar7->nCap;
                  if (pVVar7->nSize == uVar2) {
                    if ((int)uVar2 < 0x10) {
                      p_00 = (SC_Lib *)pVVar7->pArray;
                      if (p_00 == (SC_Lib *)0x0) {
                        p_00 = (SC_Lib *)&DAT_00000010;
                        pcVar8 = (char *)malloc(0x10);
                      }
                      else {
                        pcVar8 = (char *)realloc(p_00,0x10);
                      }
                      pSVar18 = (SC_Lib *)&DAT_00000010;
                    }
                    else {
                      pSVar18 = (SC_Lib *)((ulong)uVar2 * 2);
                      if ((int)pSVar18 <= (int)uVar2) goto LAB_003f33c9;
                      p_00 = (SC_Lib *)pVVar7->pArray;
                      if (p_00 == (SC_Lib *)0x0) {
                        p_00 = pSVar18;
                        pcVar8 = (char *)malloc((size_t)pSVar18);
                      }
                      else {
                        pcVar8 = (char *)realloc(p_00,(size_t)pSVar18);
                      }
                    }
                    pVVar7->pArray = pcVar8;
                    pVVar7->nCap = (int)pSVar18;
                  }
LAB_003f33c9:
                  iVar5 = pVVar7->nSize;
                  pVVar7->nSize = iVar5 + 1;
                  pVVar7->pArray[iVar5] = cVar1;
                  uVar20 = uVar20 + 1;
                } while (((uint)sVar19 & 0x7fffffff) != uVar20);
              }
              lVar16 = lVar16 + 1;
            } while (lVar16 < pRepr->n_inputs);
          }
          iVar17 = iVar17 + 1;
        }
      }
LAB_003f341b:
      lVar6 = lVar6 + 1;
    } while (lVar6 < (p->vCells).nSize);
  }
  lVar6 = 0;
  do {
    cVar1 = "\n.end\n"[lVar6];
    uVar2 = pVVar7->nCap;
    if (pVVar7->nSize == uVar2) {
      if ((int)uVar2 < 0x10) {
        if (pVVar7->pArray == (char *)0x0) {
          pcVar8 = (char *)malloc(0x10);
        }
        else {
          pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
        }
        sVar19 = 0x10;
      }
      else {
        sVar19 = (ulong)uVar2 * 2;
        if ((int)sVar19 <= (int)uVar2) goto LAB_003f34bd;
        if (pVVar7->pArray == (char *)0x0) {
          pcVar8 = (char *)malloc(sVar19);
        }
        else {
          pcVar8 = (char *)realloc(pVVar7->pArray,sVar19);
        }
      }
      pVVar7->pArray = pcVar8;
      pVVar7->nCap = (int)sVar19;
    }
LAB_003f34bd:
    iVar14 = pVVar7->nSize;
    pVVar7->nSize = iVar14 + 1;
    pVVar7->pArray[iVar14] = cVar1;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 6);
  uVar2 = pVVar7->nCap;
  if (pVVar7->nSize == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (pVVar7->pArray == (char *)0x0) {
        pcVar8 = (char *)malloc(0x10);
      }
      else {
        pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
      }
      sVar19 = 0x10;
    }
    else {
      sVar19 = (ulong)uVar2 * 2;
      if ((int)sVar19 <= (int)uVar2) goto LAB_003f353a;
      if (pVVar7->pArray == (char *)0x0) {
        pcVar8 = (char *)malloc(sVar19);
      }
      else {
        pcVar8 = (char *)realloc(pVVar7->pArray,sVar19);
      }
    }
    pVVar7->pArray = pcVar8;
    pVVar7->nCap = (int)sVar19;
  }
LAB_003f353a:
  iVar14 = pVVar7->nSize;
  pVVar7->nSize = iVar14 + 1;
  pVVar7->pArray[iVar14] = '\0';
  if (pnCellCount != (int *)0x0) {
    *pnCellCount = iVar17;
  }
  return pVVar7;
}

Assistant:

Vec_Str_t * Abc_SclProduceGenlibStrProfile( SC_Lib * p, Mio_Library_t * pLib, float Slew, float Gain, int nGatesMin, int * pnCellCount )
{
    char Buffer[200];
    Vec_Str_t * vStr;
    SC_Cell * pRepr;
    SC_Pin * pPin;
    int i, k, Count = 2, nClassMax = 0;
    // find the largest number of cells in a class
    SC_LibForEachCellClass( p, pRepr, i )
        if ( pRepr->n_outputs == 1 )
            nClassMax = Abc_MaxInt( nClassMax, Abc_SclClassCellNum(pRepr) );
    // update the number
    if ( nGatesMin && nGatesMin >= nClassMax )
        nGatesMin = 0;
    // mark skipped cells
    Abc_SclMarkSkippedCells( p );
    vStr = Vec_StrAlloc( 1000 );
    Vec_StrPrintStr( vStr, "GATE _const0_            0.00 z=CONST0;\n" );
    Vec_StrPrintStr( vStr, "GATE _const1_            0.00 z=CONST1;\n" );
    SC_LibForEachCell( p, pRepr, i )
    {
        if ( pRepr->n_inputs == 0 )
            continue;
        if ( pRepr->n_outputs > 1 )
            continue;
        if ( nGatesMin && pRepr->n_inputs > 2 && Abc_SclClassCellNum(pRepr) < nGatesMin )
            continue;
        // check if the gate is in the profile
        if ( pRepr->n_inputs > 1 )
        {
            Mio_Gate_t * pGate = Mio_LibraryReadGateByName( pLib, pRepr->pName, NULL );
            if ( pGate == NULL || Mio_GateReadProfile(pGate) == 0 )
                continue;
        }
        // process gate
        assert( strlen(pRepr->pName) < 200 );
        Vec_StrPrintStr( vStr, "GATE " );
        sprintf( Buffer, "%-16s", pRepr->pName );
        Vec_StrPrintStr( vStr, Buffer );
        Vec_StrPrintStr( vStr, " " );
//        sprintf( Buffer, "%7.2f", Abc_SclComputeAreaClass(pRepr) );
        sprintf( Buffer, "%7.2f", pRepr->area );
        Vec_StrPrintStr( vStr, Buffer );
        Vec_StrPrintStr( vStr, " " );
        Vec_StrPrintStr( vStr, SC_CellPinName(pRepr, pRepr->n_inputs) );
        Vec_StrPrintStr( vStr, "=" );
        Vec_StrPrintStr( vStr, SC_CellPinOutFunc(pRepr, 0) ? SC_CellPinOutFunc(pRepr, 0) : "?" );
        Vec_StrPrintStr( vStr, ";\n" );
        SC_CellForEachPinIn( pRepr, pPin, k )
        {
            float Delay = Abc_SclComputeDelayClassPin( p, pRepr, k, Slew, Gain );
            assert( Delay > 0 );
            Vec_StrPrintStr( vStr, "         PIN " );
            sprintf( Buffer, "%-4s", pPin->pName );
            Vec_StrPrintStr( vStr, Buffer );
            sprintf( Buffer, " UNKNOWN  1  999  %7.2f  0.00  %7.2f  0.00\n", Delay, Delay );
            Vec_StrPrintStr( vStr, Buffer );
        }
        Count++;
    }
    Vec_StrPrintStr( vStr, "\n.end\n" );
    Vec_StrPush( vStr, '\0' );
//    printf( "GENLIB library with %d gates is produced:\n", Count );
//    printf( "%s", Vec_StrArray(vStr) );
    if ( pnCellCount )
        *pnCellCount = Count;
    return vStr;
}